

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O0

void __thiscall Assimp::D3MF::XmlSerializer::ReadMetadata(XmlSerializer *this)

{
  XmlReader *pXVar1;
  int iVar2;
  undefined8 uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  undefined1 local_b0 [8];
  MetaEntry entry;
  string local_68 [8];
  string value;
  allocator<char> local_31;
  string local_30 [8];
  string name;
  XmlSerializer *this_local;
  
  pXVar1 = this->xmlReader;
  name.field_2._8_8_ = this;
  uVar3 = std::__cxx11::string::c_str();
  iVar2 = (*pXVar1->_vptr_IIrrXMLReader[7])(pXVar1,uVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,(char *)CONCAT44(extraout_var,iVar2),&local_31);
  std::allocator<char>::~allocator(&local_31);
  (*this->xmlReader->_vptr_IIrrXMLReader[2])();
  iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[0xe])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,(char *)CONCAT44(extraout_var_00,iVar2),
             (allocator<char> *)(entry.value.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(entry.value.field_2._M_local_buf + 0xf));
  uVar4 = std::__cxx11::string::empty();
  entry.value.field_2._M_local_buf[8] = (uVar4 & 1) != 0;
  if (!(bool)entry.value.field_2._M_local_buf[8]) {
    MetaEntry::MetaEntry((MetaEntry *)local_b0);
    std::__cxx11::string::operator=((string *)local_b0,local_30);
    std::__cxx11::string::operator=((string *)(entry.name.field_2._M_local_buf + 8),local_68);
    std::
    vector<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
    ::push_back(&this->mMetaData,(value_type *)local_b0);
    MetaEntry::~MetaEntry((MetaEntry *)local_b0);
  }
  entry.value.field_2._9_3_ = 0;
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void ReadMetadata() {
        const std::string name = xmlReader->getAttributeValue( D3MF::XmlTag::meta_name.c_str() );
        xmlReader->read();
        const std::string value = xmlReader->getNodeData();

        if ( name.empty() ) {
            return;
        }

        MetaEntry entry;
        entry.name = name;
        entry.value = value;
        mMetaData.push_back( entry );
    }